

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall VulkanHppGenerator::generateEnumsHppFile(VulkanHppGenerator *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_348;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_303;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_302;
  undefined1 local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  string local_2b8;
  string local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  undefined1 local_170 [64];
  undefined1 local_130 [8];
  string str;
  undefined1 local_108 [8];
  string vulkanEnumsHppTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string vulkan_enums_hpp;
  VulkanHppGenerator *this_local;
  
  vulkan_enums_hpp.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp",&local_91
            );
  std::operator+(&local_70,&local_90,"/vulkan/");
  std::operator+(&local_50,&local_70,&this->m_api);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"_enums.hpp");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vulkanEnumsHppTemplate.field_2 + 8),"VulkanHppGenerator: Generating ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vulkanEnumsHppTemplate.field_2 + 8)," ...\n");
  SyncedMessageHandler::message(&messager,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)(vulkanEnumsHppTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,
             "${licenseHeader}\n#ifndef VULKAN_ENUMS_HPP\n#  define VULKAN_ENUMS_HPP\n\n// include-what-you-use: make sure, vulkan.hpp is used by code-completers\n// IWYU pragma: private; include \"vulkan.hpp\"\n\nnamespace VULKAN_HPP_NAMESPACE\n{\n${Flags}\n\n${enums}\n${objectTypeToDebugReportObjectType}\n}   // namespace VULKAN_HPP_NAMESPACE\n#endif\n"
             ,(allocator<char> *)(str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
  local_301 = 1;
  local_278 = &local_270;
  generateEnums_abi_cxx11_(&local_298,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_270,(char (*) [6])"enums",&local_298);
  local_278 = &local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"Flags.hpp",&local_2d9);
  anon_unknown.dwarf_b1723::readSnippet(&local_2b8,&local_2d8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_230,(char (*) [6])0x2c579c,&local_2b8);
  local_278 = &local_1f0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_true>
            (local_278,(char (*) [14])"licenseHeader",&this->m_vulkanLicenseHeader);
  local_278 = &local_1b0;
  generateObjectTypeToDebugReportObjectType_abi_cxx11_(&local_300,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[34],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1b0,(char (*) [34])"objectTypeToDebugReportObjectType",&local_300);
  local_301 = 0;
  local_170._0_8_ = &local_270;
  local_170._8_8_ = 4;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_303);
  __l._M_len = local_170._8_8_;
  __l._M_array = (iterator)local_170._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(local_170 + 0x10),__l,&local_302,&local_303);
  replaceWithMap((string *)local_130,(string *)local_108,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_170 + 0x10));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_170 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_303);
  local_348 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_170;
  do {
    local_348 = local_348 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_348);
  } while (local_348 != &local_270);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_298);
  writeToFile((string *)local_130,(string *)local_30);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void VulkanHppGenerator::generateEnumsHppFile() const
{
  std::string const vulkan_enums_hpp = std::string( BASE_PATH ) + "/vulkan/" + m_api + "_enums.hpp";
  messager.message( "VulkanHppGenerator: Generating " + vulkan_enums_hpp + " ...\n" );

  std::string const vulkanEnumsHppTemplate = R"(${licenseHeader}
#ifndef VULKAN_ENUMS_HPP
#  define VULKAN_ENUMS_HPP

// include-what-you-use: make sure, vulkan.hpp is used by code-completers
// IWYU pragma: private; include "vulkan.hpp"

namespace VULKAN_HPP_NAMESPACE
{
${Flags}

${enums}
${objectTypeToDebugReportObjectType}
}   // namespace VULKAN_HPP_NAMESPACE
#endif
)";

  std::string str = replaceWithMap( vulkanEnumsHppTemplate,
                                    { { "enums", generateEnums() },
                                      { "Flags", readSnippet( "Flags.hpp" ) },
                                      { "licenseHeader", m_vulkanLicenseHeader },
                                      { "objectTypeToDebugReportObjectType", generateObjectTypeToDebugReportObjectType() } } );

  writeToFile( str, vulkan_enums_hpp );
}